

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

int __thiscall FParser::FindOperator(FParser *this,int start,int stop,char *value)

{
  int iVar1;
  int local_3c;
  int local_30;
  int local_2c;
  int bracketlevel;
  int i;
  char *value_local;
  int stop_local;
  int start_local;
  FParser *this_local;
  
  local_30 = 0;
  local_2c = start;
  do {
    if (stop < local_2c) {
      return -1;
    }
    if (this->TokenType[local_2c] == operator_) {
      if (*this->Tokens[local_2c] == '(') {
        local_3c = 1;
      }
      else {
        local_3c = 0;
        if (*this->Tokens[local_2c] == ')') {
          local_3c = -1;
        }
      }
      local_30 = local_3c + local_30;
      if ((local_30 == 0) && (iVar1 = strcmp(value,this->Tokens[local_2c]), iVar1 == 0)) {
        return local_2c;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int FParser::FindOperator(int start, int stop, const char *value)
{
	int i;
	int bracketlevel = 0;
	
	for(i=start; i<=stop; i++)
    {
		// only interested in operators
		if(TokenType[i] != operator_) continue;
		
		// use bracketlevel to check the number of brackets
		// which we are inside
		bracketlevel += Tokens[i][0]=='(' ? 1 :
		Tokens[i][0]==')' ? -1 : 0;
		
		// only check when we are not in brackets
		if(!bracketlevel && !strcmp(value, Tokens[i]))
			return i;
    }
	
	return -1;
}